

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O1

void ImTui_ImplNcurses_DrawScreen(bool active)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  uint uVar11;
  undefined7 in_register_00000039;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  timespec local_40;
  
  if ((int)CONCAT71(in_register_00000039,active) != 0) {
    nActiveFrames = 10;
  }
  wrefresh(_stdscr);
  uVar1 = g_screen->nx;
  uVar2 = g_screen->ny;
  lVar8 = (long)(int)uVar1;
  bVar4 = screenPrev.ny == uVar2;
  bVar5 = screenPrev.nx == uVar1;
  if ((!bVar4 || !bVar5) &&
     (screenPrev.nx = uVar1, screenPrev.ny = uVar2, screenPrev.nmax < (int)(uVar2 * uVar1))) {
    if (screenPrev.data != (TCell *)0x0) {
      operator_delete__(screenPrev.data);
    }
    screenPrev.nmax = (int)((long)screenPrev.ny * (long)screenPrev.nx);
    uVar14 = 0xffffffffffffffff;
    if (-1 < screenPrev.nmax) {
      uVar14 = (long)screenPrev.ny * (long)screenPrev.nx * 4;
    }
    screenPrev.data = (TCell *)operator_new__(uVar14);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&curs,lVar8 + 1);
  if (0 < (int)uVar2) {
    lVar13 = 0;
    uVar14 = 0;
    iVar15 = 0;
    do {
      if (bVar4 && bVar5) {
        if (0 < (int)uVar1) {
          uVar9 = 0;
          do {
            if (*(int *)((long)screenPrev.data + uVar9 * 4 + lVar13) !=
                *(int *)((long)g_screen->data + uVar9 * 4 + lVar13)) goto LAB_00111674;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        if (!bVar4 || !bVar5) goto LAB_00111674;
      }
      else {
LAB_00111674:
        move(uVar14 & 0xffffffff,0);
        if (0 < (int)uVar1) {
          uVar11 = 0xffffffff;
          uVar9 = 0;
          do {
            uVar3 = *(uint *)((long)g_screen->data + uVar9 * 4 + lVar13);
            uVar12 = uVar3 >> 0x10 & 0xff | (uVar3 >> 0x18) << 8;
            if (colPairs._M_elems[uVar12].first == false) {
              init_pair((int)(short)nColPairs);
              colPairs._M_elems[uVar12].first = true;
              colPairs._M_elems[uVar12].second = nColPairs;
              nColPairs = nColPairs + 1;
            }
            if (uVar11 != uVar12) {
              if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar6 = (long)iVar15;
                iVar15 = 0;
                curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6] = '\0';
                waddnstr(_stdscr,curs.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,0xffffffff);
                *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = '\0';
              }
              wattr_on(_stdscr,(colPairs._M_elems[uVar12].second & 0xffU) << 8,0);
              uVar11 = uVar12;
            }
            if ((short)uVar3 == 0) {
              uVar3 = 0x2e;
            }
            lVar6 = (long)iVar15;
            iVar15 = iVar15 + 1;
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6] = (uchar)uVar3;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar6 = (long)iVar15;
          iVar15 = 0;
          curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = '\0';
          waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,0xffffffff);
          *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = '\0';
        }
        if (bVar4 && bVar5) {
          memcpy(screenPrev.data + uVar14 * lVar8,g_screen->data + uVar14 * lVar8,lVar8 * 4);
        }
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + lVar8 * 4;
    } while (uVar14 != uVar2);
  }
  if (!bVar4 || !bVar5) {
    memcpy(screenPrev.data,g_screen->data,(long)(int)(uVar2 * uVar1) << 2);
  }
  iVar15 = nActiveFrames;
  nActiveFrames = nActiveFrames + -1;
  lVar13 = std::chrono::_V2::system_clock::now();
  lVar8 = _ZL7g_vsync_3;
  plVar10 = &_ZL7g_vsync_1;
  if (0 < iVar15) {
    plVar10 = &_ZL7g_vsync_0;
  }
  lVar6 = *plVar10;
  wtimeout(_stdscr,0);
  uVar14 = lVar13 / 1000;
  if (uVar14 < (lVar6 + lVar8) - 100U) {
    lVar8 = lVar8 + lVar6;
    do {
      auVar16._8_4_ = (int)(uVar14 >> 0x20);
      auVar16._0_8_ = uVar14;
      auVar16._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)((ulong)_ZL7g_vsync_0 >> 0x20);
      auVar17._0_8_ = _ZL7g_vsync_0;
      auVar17._12_4_ = 0x45300000;
      auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar18._0_8_ = lVar8;
      auVar18._12_4_ = 0x45300000;
      if ((((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)_ZL7g_vsync_0) - 4503599627370496.0)) * 0.5 +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0) <
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) &&
         (iVar15 = wgetch(_stdscr), iVar15 != -1)) {
        ungetch(iVar15);
        wtimeout(_stdscr,1);
        return;
      }
      auVar19._8_4_ = (int)((ulong)_ZL7g_vsync_0 >> 0x20);
      auVar19._0_8_ = _ZL7g_vsync_0;
      auVar19._12_4_ = 0x45300000;
      dVar21 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)_ZL7g_vsync_0) - 4503599627370496.0)) * 0.9;
      uVar9 = (ulong)dVar21;
      lVar13 = lVar8 - uVar14;
      auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar20._0_8_ = lVar13;
      auVar20._12_4_ = 0x45300000;
      dVar22 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) * 0.9;
      uVar14 = (ulong)dVar22;
      uVar9 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
      uVar14 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
      if (uVar9 <= uVar14) {
        uVar14 = uVar9;
      }
      if (0 < (long)uVar14) {
        local_40.tv_sec = uVar14 / 1000000;
        local_40.tv_nsec = (uVar14 % 1000000) * 1000;
        do {
          iVar15 = nanosleep(&local_40,&local_40);
          if (iVar15 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      }
      lVar13 = std::chrono::_V2::system_clock::now();
      uVar14 = lVar13 / 1000;
    } while (uVar14 < lVar8 - 100U);
  }
  _ZL7g_vsync_3 = _ZL7g_vsync_3 + lVar6;
  wtimeout(_stdscr,1);
  return;
}

Assistant:

void ImTui_ImplNcurses_DrawScreen(bool active) {
    if (active) nActiveFrames = 10;

    wrefresh(stdscr);

    int nx = g_screen->nx;
    int ny = g_screen->ny;

    bool compare = true;

    if (screenPrev.nx != nx || screenPrev.ny != ny) {
        screenPrev.resize(nx, ny);
        compare = false;
    }

    int ic = 0;
    curs.resize(nx + 1);

    for (int y = 0; y < ny; ++y) {
        bool isSame = compare;
        if (compare) {
            for (int x = 0; x < nx; ++x) {
                if (screenPrev.data[y*nx + x] != g_screen->data[y*nx + x]) {
                    isSame = false;
                    break;
                }
            }
        }
        if (isSame) continue;

        int lastp = 0xFFFFFFFF;
        move(y, 0);
        for (int x = 0; x < nx; ++x) {
            auto cell = g_screen->data[y*nx + x];
            uint16_t f = (cell & 0x00FF0000) >> 16;
            uint16_t b = (cell & 0xFF000000) >> 24;
            uint16_t p = b*256 + f;

            if (colPairs[p].first == false) {
                init_pair(nColPairs, f, b);
                colPairs[p].first = true;
                colPairs[p].second = nColPairs;
                ++nColPairs;
            }

            if (lastp != (int) p) {
                if (curs.size() > 0) {
                    curs[ic] = 0;
                    addstr((char *) curs.data());
                    ic = 0;
                    curs[0] = 0;
                }
                attron(COLOR_PAIR(colPairs[p].second));
                lastp = p;
            }

            uint16_t c = cell & 0x0000FFFF;
            curs[ic++] = c > 0 ? c : '.';
        }

        if (curs.size() > 0) {
            curs[ic] = 0;
            addstr((char *) curs.data());
            ic = 0;
            curs[0] = 0;
        }

        if (compare) {
            memcpy(screenPrev.data + y*nx, g_screen->data + y*nx, nx*sizeof(ImTui::TCell));
        }
    }

    if (!compare) {
        memcpy(screenPrev.data, g_screen->data, nx*ny*sizeof(ImTui::TCell));
    }

    g_vsync.wait(nActiveFrames --> 0);
}